

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

Bit16s envelope_calcsin5(Bit16u phase,Bit16u envelope)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = phase & 0x3ff;
  uVar2 = 0x1000;
  if (uVar3 < 0x200) {
    uVar1 = uVar3 * 2 & 0xff;
    uVar2 = uVar1 ^ 0xfe;
    if (-1 < (char)uVar3) {
      uVar2 = uVar1;
    }
    uVar2 = (uint)logsinrom[uVar2];
  }
  uVar2 = uVar2 + (uint)envelope * 8;
  uVar3 = 0x1fff;
  if (uVar2 < 0x1fff) {
    uVar3 = uVar2;
  }
  return (Bit16s)(((uint)exprom[~uVar3 & 0xff] * 2 | 0x800) >> ((byte)(uVar3 >> 8) & 0x1f));
}

Assistant:

Bit16s envelope_calcsin5(Bit16u phase, Bit16u envelope) {
	phase &= 0x3ff;
	Bit16u out = 0;
	if (phase & 0x200) {
		out = 0x1000;
	}
	else if (phase & 0x80) {
		out = logsinrom[((phase ^ 0xff) << 1) & 0xff];
	}
	else {
		out = logsinrom[(phase << 1) & 0xff];
	}
	return envelope_calcexp(out + (envelope << 3));
}